

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_pool_1d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int s0,int p0)

{
  ggml_tensor *tensor;
  int32_t params [4];
  long local_58;
  int64_t local_50;
  int64_t iStack_48;
  int64_t local_40;
  
  local_58 = (long)((((float)p0 + (float)p0 + (float)a->ne[0]) - (float)k0) / (float)s0 + 1.0);
  local_50 = a->ne[1];
  iStack_48 = a->ne[2];
  local_40 = a->ne[3];
  tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,&local_58);
  params[0] = op;
  params[1] = k0;
  params[2] = s0;
  params[3] = p0;
  ggml_set_op_params(tensor,params,0x10);
  tensor->op = GGML_OP_POOL_1D;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_pool_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   s0,
        int                   p0) {
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        a->ne[1],
        a->ne[2],
        a->ne[3],
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, s0, p0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_1D;
    result->src[0] = a;

    return result;
}